

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_free(REF_SUBDIV ref_subdiv)

{
  REF_STATUS ref_private_macro_code_rss;
  REF_SUBDIV ref_subdiv_local;
  
  if (ref_subdiv == (REF_SUBDIV)0x0) {
    ref_subdiv_local._4_4_ = 2;
  }
  else {
    if (ref_subdiv->node != (REF_INT *)0x0) {
      free(ref_subdiv->node);
    }
    if (ref_subdiv->mark != (REF_INT *)0x0) {
      free(ref_subdiv->mark);
    }
    ref_subdiv_local._4_4_ = ref_edge_free(ref_subdiv->edge);
    if (ref_subdiv_local._4_4_ == 0) {
      if (ref_subdiv != (REF_SUBDIV)0x0) {
        free(ref_subdiv);
      }
      ref_subdiv_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0xa3
             ,"ref_subdiv_free",(ulong)ref_subdiv_local._4_4_,"free edge");
    }
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_free(REF_SUBDIV ref_subdiv) {
  if (NULL == (void *)ref_subdiv) return REF_NULL;

  ref_free(ref_subdiv->node);
  ref_free(ref_subdiv->mark);
  RSS(ref_edge_free(ref_subdiv_edge(ref_subdiv)), "free edge");

  ref_free(ref_subdiv);

  return REF_SUCCESS;
}